

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O3

LY_ERR ly_ctx_new_yldata(char *search_dir,lyd_node *tree,int options,ly_ctx **ctx)

{
  lyd_node *plVar1;
  byte *pbVar2;
  lysc_node *plVar3;
  long lVar4;
  ly_ctx **pplVar5;
  LY_ERR LVar6;
  int iVar7;
  char *pcVar8;
  char *pcVar9;
  char **ppcVar10;
  lyd_node *plVar11;
  ulong uVar12;
  lys_module *plVar13;
  char *pcVar14;
  anon_union_8_3_0df1e6ad_for_ly_set_2 *paVar15;
  LY_ERR LVar16;
  ly_ctx *plVar17;
  ulong uVar18;
  uint32_t uVar19;
  ulong uVar20;
  void *pvVar21;
  ly_ctx *ctx_new;
  ly_set *set;
  ly_set *set_1;
  ly_set features;
  ly_ctx *local_80;
  LY_ERR local_74;
  ly_ctx *local_70;
  ly_set *local_68;
  ly_set *local_60;
  ly_set local_58;
  ly_set local_48;
  ly_ctx **local_38;
  
  local_68 = (ly_set *)0x0;
  local_58.size = 0;
  local_58.count = 0;
  local_58.field_2.dnodes = (lyd_node **)0x0;
  local_80 = (ly_ctx *)0x0;
  if (tree == (lyd_node *)0x0) {
    pcVar8 = "tree";
  }
  else {
    if (ctx != (ly_ctx **)0x0) {
      plVar17 = *ctx;
      local_38 = ctx;
      if ((*ctx != (ly_ctx *)0x0) ||
         (LVar6 = ly_ctx_new(search_dir,(uint16_t)options,&local_80), plVar17 = local_80,
         LVar6 == LY_SUCCESS)) {
        local_80 = plVar17;
        LVar16 = options & LY_EPLUGIN;
        if (LVar16 == LY_SUCCESS) {
          local_80->flags = local_80->flags | 0x80;
        }
        LVar6 = lyd_find_xpath(tree,"/ietf-yang-library:yang-library/module-set[1]/module",&local_68
                              );
        plVar17 = local_80;
        if (LVar6 == LY_SUCCESS) {
          if (local_68->count == 0) {
            local_48.size = 0;
            local_48.count = 0;
            local_48.field_2.dnodes = (lyd_node **)0x0;
            LVar6 = lyd_find_xpath(tree,"/ietf-yang-library:yang-library/modules-state/module",
                                   &local_60);
            if (LVar6 != LY_SUCCESS) goto LAB_0011c070;
            local_74 = LVar16;
            if (local_60->count != 0) {
              uVar20 = 0;
              local_70 = plVar17;
              do {
                plVar1 = (local_60->field_2).dnodes[uVar20];
                if ((plVar1 == (lyd_node *)0x0) ||
                   (((plVar1->schema != (lysc_node *)0x0 &&
                     ((plVar1->schema->nodetype & 0x711) == 0)) ||
                    (pvVar21 = *(void **)(plVar1 + 1), pvVar21 == (void *)0x0)))) {
                  pcVar8 = (char *)0x0;
                  pcVar9 = (char *)0x0;
                }
                else {
                  pcVar9 = (char *)0x0;
                  pcVar8 = (char *)0x0;
                  do {
                    pbVar2 = *(byte **)((long)pvVar21 + 8);
                    pcVar14 = *(char **)(pbVar2 + 0x28);
                    iVar7 = strcmp(pcVar14,"name");
                    if (iVar7 == 0) {
                      if ((*pbVar2 & 0xc) == 0) {
                        pcVar8 = (char *)0x0;
                      }
                      else {
                        pcVar8 = *(char **)((long)pvVar21 + 0x38);
                        if (pcVar8 == (char *)0x0) {
                          pcVar8 = lyd_value_get_canonical
                                             ((ly_ctx *)**(undefined8 **)(pbVar2 + 8),
                                              (lyd_value *)((long)pvVar21 + 0x38));
                        }
                      }
                    }
                    else {
                      iVar7 = strcmp(pcVar14,"revision");
                      if (iVar7 == 0) {
                        if ((*pbVar2 & 0xc) == 0) {
                          pcVar9 = (char *)0x0;
                        }
                        else {
                          pcVar9 = *(char **)((long)pvVar21 + 0x38);
                          if (pcVar9 == (char *)0x0) {
                            pcVar9 = lyd_value_get_canonical
                                               ((ly_ctx *)**(undefined8 **)(pbVar2 + 8),
                                                (lyd_value *)((long)pvVar21 + 0x38));
                          }
                        }
                      }
                      else {
                        iVar7 = strcmp(pcVar14,"feature");
                        if (iVar7 == 0) {
                          LVar6 = ly_set_add(&local_48,pvVar21,'\0',(uint32_t *)0x0);
                          if (LVar6 != LY_SUCCESS) goto LAB_0011c037;
                        }
                        else {
                          iVar7 = strcmp(pcVar14,"conformance-type");
                          if (iVar7 == 0) {
                            pcVar14 = *(char **)((long)pvVar21 + 0x38);
                            if (pcVar14 == (char *)0x0) {
                              pcVar14 = lyd_value_get_canonical
                                                  ((ly_ctx *)**(undefined8 **)(pbVar2 + 8),
                                                   (lyd_value *)((long)pvVar21 + 0x38));
                            }
                            iVar7 = strcmp(pcVar14,"import");
                            if (iVar7 == 0) goto LAB_0011bfdf;
                          }
                        }
                      }
                    }
                    pvVar21 = *(void **)((long)pvVar21 + 0x18);
                  } while (pvVar21 != (void *)0x0);
                }
                uVar19 = local_48.count;
                uVar12 = (ulong)local_48.count;
                ppcVar10 = (char **)malloc((ulong)(local_48.count + 1) << 3);
                if (ppcVar10 == (char **)0x0) {
                  LVar6 = LY_EMEM;
                  goto LAB_0011c037;
                }
                if (uVar19 == 0) {
                  uVar12 = 0;
                }
                else {
                  uVar18 = 0;
                  do {
                    plVar1 = local_48.field_2.dnodes[uVar18];
                    if (plVar1 == (lyd_node *)0x0) {
LAB_0011bf84:
                      plVar11 = (lyd_node *)0x0;
                    }
                    else {
                      plVar3 = plVar1->schema;
                      if (plVar3 == (lysc_node *)0x0) {
                        plVar11 = plVar1[1].prev;
                      }
                      else {
                        if ((plVar3->nodetype & 0xc) == 0) goto LAB_0011bf84;
                        plVar11 = *(lyd_node **)(plVar1 + 1);
                        if (plVar11 == (lyd_node *)0x0) {
                          plVar11 = (lyd_node *)
                                    lyd_value_get_canonical
                                              (plVar3->module->ctx,(lyd_value *)(plVar1 + 1));
                          uVar12 = (ulong)local_48._0_8_ >> 0x20;
                        }
                      }
                    }
                    ppcVar10[uVar18] = (char *)plVar11;
                    uVar18 = uVar18 + 1;
                  } while (uVar18 < uVar12);
                }
                ppcVar10[uVar12] = (char *)0x0;
                ly_set_clean(&local_48,free);
                plVar13 = ly_ctx_load_module(local_70,pcVar8,pcVar9,ppcVar10);
                free(ppcVar10);
                if (plVar13 == (lys_module *)0x0) {
                  LVar6 = LY_EINVAL;
                  ly_log(local_70,LY_LLERR,LY_EINVAL,
                         "Unable to load module specified by yang library data.");
                  ly_set_free(local_60,free);
                  goto LAB_0011c070;
                }
LAB_0011bfdf:
                uVar20 = uVar20 + 1;
              } while (uVar20 < local_60->count);
            }
            LVar6 = LY_SUCCESS;
LAB_0011c037:
            ly_set_clean(&local_48,free);
            ly_set_free(local_60,free);
            if (LVar6 != LY_SUCCESS) goto LAB_0011c070;
          }
          else {
            uVar20 = 0;
            local_74 = LVar16;
            local_70 = (ly_ctx *)tree;
            do {
              plVar1 = (local_68->field_2).dnodes[uVar20];
              if (((plVar1 == (lyd_node *)0x0) ||
                  ((plVar1->schema != (lysc_node *)0x0 && ((plVar1->schema->nodetype & 0x711) == 0))
                  )) || (pvVar21 = *(void **)(plVar1 + 1), pvVar21 == (void *)0x0)) {
                pcVar9 = (char *)0x0;
                pcVar8 = (char *)0x0;
              }
              else {
                pcVar8 = (char *)0x0;
                pcVar9 = (char *)0x0;
                do {
                  pbVar2 = *(byte **)((long)pvVar21 + 8);
                  pcVar14 = *(char **)(pbVar2 + 0x28);
                  iVar7 = strcmp(pcVar14,"name");
                  if (iVar7 == 0) {
                    if ((*pbVar2 & 0xc) == 0) {
                      pcVar8 = (char *)0x0;
                    }
                    else {
                      pcVar8 = *(char **)((long)pvVar21 + 0x38);
                      if (pcVar8 == (char *)0x0) {
                        pcVar8 = lyd_value_get_canonical
                                           ((ly_ctx *)**(undefined8 **)(pbVar2 + 8),
                                            (lyd_value *)((long)pvVar21 + 0x38));
                      }
                    }
                  }
                  else {
                    iVar7 = strcmp(pcVar14,"revision");
                    if (iVar7 == 0) {
                      if ((*pbVar2 & 0xc) == 0) {
                        pcVar9 = (char *)0x0;
                      }
                      else {
                        pcVar9 = *(char **)((long)pvVar21 + 0x38);
                        if (pcVar9 == (char *)0x0) {
                          pcVar9 = lyd_value_get_canonical
                                             ((ly_ctx *)**(undefined8 **)(pbVar2 + 8),
                                              (lyd_value *)((long)pvVar21 + 0x38));
                        }
                      }
                    }
                    else {
                      iVar7 = strcmp(pcVar14,"feature");
                      if ((iVar7 == 0) &&
                         (LVar6 = ly_set_add(&local_58,pvVar21,'\0',(uint32_t *)0x0),
                         LVar6 != LY_SUCCESS)) goto LAB_0011c070;
                    }
                  }
                  pvVar21 = *(void **)((long)pvVar21 + 0x18);
                } while (pvVar21 != (void *)0x0);
              }
              uVar19 = local_58.count;
              ppcVar10 = (char **)malloc((ulong)(local_58.count + 1) << 3);
              if (ppcVar10 == (char **)0x0) {
                LVar6 = LY_EMEM;
                goto LAB_0011c070;
              }
              if (uVar19 == 0) {
                uVar12 = 0;
              }
              else {
                uVar18 = 0;
                do {
                  plVar1 = local_58.field_2.dnodes[uVar18];
                  if (plVar1 == (lyd_node *)0x0) {
LAB_0011bcca:
                    plVar11 = (lyd_node *)0x0;
                  }
                  else {
                    plVar3 = plVar1->schema;
                    if (plVar3 == (lysc_node *)0x0) {
                      plVar11 = plVar1[1].prev;
                    }
                    else {
                      if ((plVar3->nodetype & 0xc) == 0) goto LAB_0011bcca;
                      plVar11 = *(lyd_node **)(plVar1 + 1);
                      if (plVar11 == (lyd_node *)0x0) {
                        plVar11 = (lyd_node *)
                                  lyd_value_get_canonical
                                            (plVar3->module->ctx,(lyd_value *)(plVar1 + 1));
                        uVar19 = local_58.count;
                      }
                    }
                  }
                  ppcVar10[uVar18] = (char *)plVar11;
                  uVar18 = uVar18 + 1;
                  uVar12 = (ulong)uVar19;
                } while (uVar18 < uVar12);
              }
              ppcVar10[uVar12] = (char *)0x0;
              ly_set_clean(&local_58,(_func_void_void_ptr *)0x0);
              plVar13 = ly_ctx_load_module(local_80,pcVar8,pcVar9,ppcVar10);
              free(ppcVar10);
              if (plVar13 == (lys_module *)0x0) {
                plVar17 = *local_38;
                if (plVar17 == (ly_ctx *)0x0) {
                  lVar4 = (local_70->dict).lock.__align;
                  if (lVar4 == 0) {
                    paVar15 = &(local_70->unres).implementing.field_2;
                  }
                  else {
                    paVar15 = *(anon_union_8_3_0df1e6ad_for_ly_set_2 **)(lVar4 + 8);
                  }
                  plVar17 = (ly_ctx *)paVar15->dnodes;
                }
                pcVar14 = "<none>";
                if (pcVar9 != (char *)0x0) {
                  pcVar14 = pcVar9;
                }
                LVar6 = LY_EINVAL;
                ly_log(plVar17,LY_LLERR,LY_EINVAL,
                       "Unable to load module %s@%s specified by yang library data.",pcVar8,pcVar14)
                ;
                goto LAB_0011c070;
              }
              uVar20 = uVar20 + 1;
            } while (uVar20 < local_68->count);
          }
          LVar6 = ly_ctx_compile(local_80);
          local_74 = local_74 | LVar6;
          if (local_74 == LY_SUCCESS) {
            local_80->flags = local_80->flags & 0xff7f;
            LVar6 = LY_SUCCESS;
          }
        }
      }
LAB_0011c070:
      ly_set_free(local_68,(_func_void_void_ptr *)0x0);
      ly_set_erase(&local_58,(_func_void_void_ptr *)0x0);
      pplVar5 = local_38;
      if (*local_38 != (ly_ctx *)0x0) {
        return LVar6;
      }
      *local_38 = local_80;
      if (LVar6 == LY_SUCCESS) {
        return LY_SUCCESS;
      }
      ly_ctx_destroy(local_80);
      *pplVar5 = (ly_ctx *)0x0;
      return LVar6;
    }
    pcVar8 = "ctx";
  }
  ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).",pcVar8,"ly_ctx_new_yldata");
  return LY_EINVAL;
}

Assistant:

LIBYANG_API_DEF LY_ERR
ly_ctx_new_yldata(const char *search_dir, const struct lyd_node *tree, int options, struct ly_ctx **ctx)
{
    const char *name = NULL, *revision = NULL;
    struct lyd_node *module, *node;
    struct ly_set *set = NULL;
    const char **feature_arr = NULL;
    struct ly_set features = {0};
    LY_ERR ret = LY_SUCCESS;
    const struct lys_module *mod;
    struct ly_ctx *ctx_new = NULL;
    ly_bool no_expl_compile = 0;
    uint32_t i, j;

    LY_CHECK_ARG_RET(NULL, tree, ctx, LY_EINVAL);

    /* create a new context */
    if (*ctx == NULL) {
        LY_CHECK_GOTO(ret = ly_ctx_new(search_dir, options, &ctx_new), cleanup);
    } else {
        ctx_new = *ctx;
    }

    /* redundant to compile modules one-by-one */
    if (!(options & LY_CTX_EXPLICIT_COMPILE)) {
        ctx_new->flags |= LY_CTX_EXPLICIT_COMPILE;
        no_expl_compile = 1;
    }

    LY_CHECK_GOTO(ret = lyd_find_xpath(tree, "/ietf-yang-library:yang-library/module-set[1]/module", &set), cleanup);
    if (set->count == 0) {
        /* perhaps a legacy data tree? */
        LY_CHECK_GOTO(ret = ly_ctx_new_yl_legacy(ctx_new, tree), cleanup);
    } else {
        /* process the data tree */
        for (i = 0; i < set->count; ++i) {
            module = set->dnodes[i];

            /* initiate */
            name = NULL;
            revision = NULL;

            /* iterate over data */
            LY_LIST_FOR(lyd_child(module), node) {
                if (!strcmp(node->schema->name, "name")) {
                    name = lyd_get_value(node);
                } else if (!strcmp(node->schema->name, "revision")) {
                    revision = lyd_get_value(node);
                } else if (!strcmp(node->schema->name, "feature")) {
                    LY_CHECK_GOTO(ret = ly_set_add(&features, node, 0, NULL), cleanup);
                }
            }

            feature_arr = malloc((features.count + 1) * sizeof *feature_arr);
            LY_CHECK_ERR_GOTO(!feature_arr, ret = LY_EMEM, cleanup);

            /* parse features into an array of strings */
            for (j = 0; j < features.count; ++j) {
                feature_arr[j] = lyd_get_value(features.dnodes[j]);
            }
            feature_arr[features.count] = NULL;
            ly_set_clean(&features, NULL);

            /* use the gathered data to load the module */
            mod = ly_ctx_load_module(ctx_new, name, revision, feature_arr);
            free(feature_arr);
            if (!mod) {
                LOGERR(*ctx ? *ctx : LYD_CTX(tree), LY_EINVAL, "Unable to load module %s@%s specified by yang library data.",
                        name, revision ? revision : "<none>");
                ret = LY_EINVAL;
                goto cleanup;
            }
        }
    }

    /* compile */
    LY_CHECK_GOTO(ret = ly_ctx_compile(ctx_new), cleanup);

    if (no_expl_compile) {
        /* unset flag */
        ctx_new->flags &= ~LY_CTX_EXPLICIT_COMPILE;
    }

cleanup:
    ly_set_free(set, NULL);
    ly_set_erase(&features, NULL);
    if (*ctx == NULL) {
        *ctx = ctx_new;
        if (ret) {
            ly_ctx_destroy(*ctx);
            *ctx = NULL;
        }
    }
    return ret;
}